

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O1

void __thiscall
amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit
          (GpuBndryFuncFab<PeleLMdummyFill> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  Box *pBVar1;
  Real RVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CoordType CVar6;
  undefined8 uVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Arena *pAVar12;
  undefined4 extraout_var;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  Real *pRVar22;
  GeometryData *pGVar23;
  int iVar24;
  long lVar25;
  BCRec *pBVar26;
  long lVar27;
  byte bVar28;
  int iVar30;
  undefined1 auVar29 [16];
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  Box bndry;
  uint local_218 [6];
  undefined4 local_200;
  Real local_1f8;
  Real RStack_1f0;
  AsyncArray<amrex::BCRec,_0> local_1e8;
  pointer local_1d0;
  long local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  undefined8 local_198;
  int local_190;
  Box local_188;
  Real local_168;
  Real RStack_160;
  Real local_158;
  Real RStack_150;
  Real local_148;
  Real RStack_140;
  undefined8 local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined8 uStack_124;
  anon_class_224_9_597d82ad local_110;
  
  bVar28 = 0;
  iVar3 = (bx->bigend).vect[0];
  uVar7 = *(undefined8 *)(bx->smallend).vect;
  iVar24 = (int)uVar7;
  iVar21 = (int)((ulong)uVar7 >> 0x20);
  uVar7 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar11 = (int)uVar7;
  iVar30 = (int)((ulong)uVar7 >> 0x20);
  iVar4 = (bx->smallend).vect[2];
  local_198 = CONCAT44((iVar11 - iVar21) + 1,(iVar3 - iVar24) + 1);
  local_190 = (iVar30 - iVar4) + 1;
  local_218[0] = (geom->domain).smallend.vect[0];
  local_1c0 = (ulong)local_218[0];
  local_218[1] = (geom->domain).smallend.vect[1];
  local_1b8 = (ulong)local_218[1];
  local_218[2] = (geom->domain).smallend.vect[2];
  local_1a8 = (ulong)local_218[2];
  uVar13 = (geom->domain).btype.itype;
  iVar18 = (~uVar13 & 1) + (geom->domain).bigend.vect[0];
  local_218[4] = (geom->domain).bigend.vect[1] + (uint)((uVar13 & 2) == 0);
  local_1b0 = (ulong)local_218[4];
  local_218[5] = (geom->domain).bigend.vect[2] + (uint)((uVar13 & 4) == 0);
  local_1a0 = (ulong)local_218[5];
  local_218[3] = iVar18;
  local_200 = 7;
  lVar25 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar25 + 0x19) == '\x01') {
      iVar5 = *(int *)((long)&local_198 + lVar25 * 4);
      local_218[lVar25] = local_218[lVar25] - iVar5;
      local_218[lVar25 + 3] = local_218[lVar25 + 3] + iVar5;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3);
  auVar29._0_4_ = -(uint)((int)local_218[4] < iVar11);
  auVar29._4_4_ = -(uint)((int)local_218[5] < iVar30);
  auVar29._8_4_ = -(uint)(iVar24 < (int)local_218[0]);
  auVar29._12_4_ = -(uint)(iVar21 < (int)local_218[1]);
  iVar24 = movmskps(3,auVar29);
  if (((iVar24 != 0) || ((int)local_218[3] < iVar3)) || (iVar4 < (int)local_218[2])) {
    pdVar8 = (dest->super_BaseFab<double>).dptr;
    iVar3 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar4 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    iVar24 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    iVar9 = (pBVar1->smallend).vect[0];
    iVar10 = (pBVar1->smallend).vect[1];
    iVar21 = (dest->super_BaseFab<double>).domain.bigend.vect[0];
    lVar19 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    lVar16 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar17 = ((long)iVar21 - (long)(pBVar1->smallend).vect[0]) + 1;
    local_148 = (geom->prob_domain).xhi[1];
    RStack_140 = (geom->prob_domain).xhi[2];
    local_158 = (geom->prob_domain).xlo[2];
    RStack_150 = (geom->prob_domain).xhi[0];
    local_168 = (geom->prob_domain).xlo[0];
    RStack_160 = (geom->prob_domain).xlo[1];
    uVar7 = *(undefined8 *)(geom->domain).bigend.vect;
    local_138 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_130 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_12c = (undefined4)uVar7;
    uStack_128 = (undefined4)((ulong)uVar7 >> 0x20);
    uStack_124 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_1f8 = (geom->super_CoordSys).dx[0];
    RStack_1f0 = (geom->super_CoordSys).dx[1];
    RVar2 = (geom->super_CoordSys).dx[2];
    uVar13 = (uint)(byte)(geom->super_CoordSys).field_0x51;
    uVar14 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    uVar15 = (uint)(byte)(geom->super_CoordSys).field_0x53;
    CVar6 = (geom->super_CoordSys).c_sys;
    local_1e8.d_data = (BCRec *)0x0;
    local_1e8.h_data = (BCRec *)0x0;
    lVar25 = lVar19;
    if (numcomp != 0) {
      local_1d0 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start + bcomp;
      local_1c8 = lVar19;
      pAVar12 = The_Pinned_Arena();
      iVar11 = (*pAVar12->_vptr_Arena[2])(pAVar12,(long)numcomp * 0x18);
      local_1e8.h_data = (BCRec *)CONCAT44(extraout_var,iVar11);
      memcpy(local_1e8.h_data,local_1d0,(long)numcomp * 0x18);
      lVar25 = local_1c8;
    }
    lVar19 = (lVar19 - iVar24) * lVar17;
    pBVar26 = local_1e8.d_data;
    if (local_1e8.d_data == (BCRec *)0x0) {
      pBVar26 = local_1e8.h_data;
    }
    lVar27 = (lVar16 - iVar4) * lVar19;
    uVar20 = lVar25 << 0x20 | (ulong)(iVar21 + 1);
    iVar24 = (int)lVar16;
    if (((geom->super_CoordSys).field_0x51 == '\0') &&
       (iVar21 = (int)local_1c0, (bx->smallend).vect[0] < iVar21)) {
      local_188.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      local_188._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_188.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_188.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_188.bigend.vect[0] = iVar21 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar21;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                (&local_188,(anon_class_224_9_3753836b *)&local_110);
    }
    if (((geom->super_CoordSys).field_0x51 == '\0') && (iVar18 < (bx->bigend).vect[0])) {
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      local_188._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_188.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_188.bigend.vect[0] = (int)uVar7;
      local_188.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      local_188.smallend.vect[1] = (int)((ulong)*(undefined8 *)(bx->smallend).vect >> 0x20);
      local_188.smallend.vect[0] = iVar18 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar18;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                (&local_188,&local_110);
    }
    if (((geom->super_CoordSys).field_0x52 == '\0') &&
       (iVar18 = (int)local_1b8, (bx->smallend).vect[1] < iVar18)) {
      local_188.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)((bx->smallend).vect + 2);
      local_188._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_188.smallend.vect[2] = (int)uVar7;
      local_188.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
      local_188.bigend.vect[1] = iVar18 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar18;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                (&local_188,(anon_class_224_9_9f34b04a *)&local_110);
    }
    if (((geom->super_CoordSys).field_0x52 == '\0') &&
       (iVar18 = (int)local_1b0, iVar18 < (bx->bigend).vect[1])) {
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      local_188._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_188.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_188.bigend.vect[0] = (int)uVar7;
      local_188.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      local_188.smallend.vect[0] = (int)*(undefined8 *)(bx->smallend).vect;
      local_188.smallend.vect[1] = iVar18 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar18;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                (&local_188,(anon_class_224_9_c15eaf8c *)&local_110);
    }
    if (((geom->super_CoordSys).field_0x53 == '\0') &&
       (iVar18 = (int)local_1a8, (bx->smallend).vect[2] < iVar18)) {
      local_188.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)((bx->smallend).vect + 2);
      local_188.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_188.smallend.vect[2] = (int)uVar7;
      local_188.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
      local_188.btype.itype = (uint)((ulong)*(undefined8 *)((bx->bigend).vect + 2) >> 0x20);
      local_188.bigend.vect[2] = iVar18 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar18;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                (&local_188,(anon_class_224_9_0715dd29 *)&local_110);
    }
    if (((geom->super_CoordSys).field_0x53 == '\0') &&
       (iVar18 = (int)local_1a0, iVar18 < (bx->bigend).vect[2])) {
      local_188.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      local_188._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_188.bigend.vect[0] = (int)uVar7;
      local_188.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      local_188.smallend.vect[2] = iVar18 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar8;
      local_110.fab.jstride = lVar17;
      local_110.fab.kstride = lVar19;
      local_110.fab.nstride = lVar27;
      local_110.fab.begin.x = iVar9;
      local_110.fab.begin.y = iVar10;
      local_110.fab.begin.z = iVar4;
      local_110.fab.end.x = (int)uVar20;
      local_110.fab.end.y = (int)(uVar20 >> 0x20);
      local_110.fab.end.z = iVar24;
      local_110.fab.ncomp = iVar3;
      local_110.dxhi = iVar18;
      pRVar22 = &local_168;
      pGVar23 = &local_110.geomdata;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar22;
        pRVar22 = pRVar22 + (ulong)bVar28 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      local_110.geomdata.dx[0] = local_1f8;
      local_110.geomdata.dx[1] = RStack_1f0;
      local_110.orig_comp = orig_comp;
      local_110.geomdata.dx[2] = RVar2;
      local_110.geomdata.is_periodic[0] = uVar13;
      local_110.geomdata.is_periodic[1] = uVar14;
      local_110.geomdata.is_periodic[2] = uVar15;
      local_110.geomdata.coord = CVar6;
      local_110.time = time;
      local_110.bcr_p = pBVar26;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMdummyFill>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                (&local_188,(anon_class_224_9_293fdc6b *)&local_110);
    }
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&local_1e8);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}